

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void printError(int error)

{
  char *__ptr;
  size_t __size;
  
  switch(error) {
  case 0:
    return;
  case -0x11:
    fwrite("threefizer missing file operand\n",0x20,1,_stderr);
    fwrite("Try \'threefizer --help\' for more information\n",0x2d,1,_stderr);
    return;
  default:
    __ptr = 
    "Something went wrong but the programmer was too lazy to write a detailed error message for this case. Sorry you are SOL.\n"
    ;
    goto LAB_00104e50;
  case -0xf:
    __ptr = "Queing resources operation stopped to prevent deadlock.\n";
    __size = 0x38;
    break;
  case -0xe:
    __ptr = "The password entered is too short\n";
    __size = 0x22;
    break;
  case -0xc:
    __ptr = "Error allocating memory\n";
    goto LAB_00104de3;
  case -0xb:
    __ptr = "Error generating MAC\n";
    __size = 0x15;
    break;
  case -10:
    __ptr = "MAC check failure the encrypted file has been modified or corrupted\n";
    __size = 0x44;
    break;
  case -9:
    __ptr = "Key generation failed\n";
    __size = 0x16;
    break;
  case -7:
    __ptr = 
    "The target file specified is not a valid file. Ensure that it exists you have access to it and that it is a regular file\n"
    ;
LAB_00104e50:
    __size = 0x79;
    break;
  case -6:
    __ptr = "The password file specified is invalid\n";
    __size = 0x27;
    break;
  case -5:
    fprintf(_stderr,
            "Header check failure. Ensure that the file you are trying to decrypt was created with this program, the password is correct and that the block size is the same as what it was when encrypting. If you are still getting this error then the file has been corrupted or modified since encryption.\n"
            ,_stderr);
    return;
  case -3:
    __ptr = 
    "File I/O failure ensure disk is not full and you have write access to the file you are trying to encrypt\n"
    ;
    __size = 0x69;
    break;
  case -2:
    __ptr = "Cipher operation failure\n";
    __size = 0x19;
    break;
  case -1:
    __ptr = "Error parsing arguments\n";
LAB_00104de3:
    __size = 0x18;
  }
  fwrite(__ptr,__size,1,_stderr);
  return;
}

Assistant:

void printError(int error)
{
    if(error == 0) { return; }

    switch(error)
    {
        case ARG_PARSING_FAIL:
            fprintf(stderr, "Error parsing arguments\n");
        break;
        case CIPHER_OPERATION_FAIL:
            fprintf(stderr, "Cipher operation failure\n");
        break;
        case FILE_IO_FAIL:
            fprintf(stderr, "File I/O failure ensure disk is not full and you have write access to the file you are trying to encrypt\n");
        break;
        case HEADER_CHECK_FAIL:
            fprintf(stderr, "Header check failure. Ensure that the file you are trying to decrypt was created with this program, the password is correct and that the block size is the same as what it was when encrypting. If you are still getting this error then the file has been corrupted or modified since encryption.\n", stderr );
        break;
        case INVALID_PASSWORD_FILE:
            fprintf(stderr, "The password file specified is invalid\n");
        break;
        case INVALID_TARGET_FILE:
            fprintf(stderr, "The target file specified is not a valid file. Ensure that it exists you have access to it and that it is a regular file\n");
        break;
        case KEY_GENERATION_FAIL:
            fprintf(stderr, "Key generation failed\n");
        break;
        case MAC_CHECK_FAIL:
            fprintf(stderr, "MAC check failure the encrypted file has been modified or corrupted\n");
        break;
        case MAC_GENERATION_FAIL:
            fprintf(stderr, "Error generating MAC\n");
        break;
        case MEMORY_ALLOCATION_FAIL:
            fprintf(stderr, "Error allocating memory\n");
        break;
        case PASSWORD_TOO_SHORT:
            fprintf(stderr, "The password entered is too short\n");
        break;
        case QUEUE_OPERATION_FAIL:
            fprintf(stderr, "Queing resources operation stopped to prevent deadlock.\n");
        break;
        case TOO_FEW_ARGUMENTS:
            fprintf(stderr, "threefizer missing file operand\n");
            fprintf(stderr, "Try 'threefizer --help' for more information\n");
        break;    
        default:
            fprintf(stderr, "Something went wrong but the programmer was too lazy to write a detailed error message for this case. Sorry you are SOL.\n");
        break;	
    }
}